

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O0

size_t __thiscall
XPMP2::UDPMulticast::RecvMC
          (UDPMulticast *this,bool bSwitchToRecvIntf,string *_pFromAddr,SockAddrTy *_pFromSockAddr,
          bool *_pbIntfChanged)

{
  bool bVar1;
  byte bVar2;
  undefined8 uVar3;
  int *piVar4;
  cmsghdr *__cmsg;
  rep rVar5;
  undefined8 *in_RCX;
  string *in_RDX;
  byte in_SIL;
  UDPMulticast *in_RDI;
  undefined1 *in_R8;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *lastRcvd;
  in6_pktinfo *in6_pktinfo;
  in_pktinfo *in_pktinfo;
  cmsghdr *cmsg;
  msghdr msg;
  iovec iovec;
  char msg_control [1024];
  ssize_t bytesRcvd;
  uint32_t ifIdx;
  SockAddrTy sa;
  cmsghdr *in_stack_fffffffffffffa70;
  cmsghdr *pcVar6;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffa78;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_fffffffffffffa80;
  allocator<char> *in_stack_fffffffffffffaa0;
  key_type *in_stack_fffffffffffffaa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffab0;
  int local_534;
  duration<long,std::ratio<1l,1l>> local_530 [8];
  undefined8 local_528;
  rep local_520;
  mapped_type *local_518;
  cmsghdr *local_510;
  string *in_stack_fffffffffffffaf8;
  NetRuntimeError *in_stack_fffffffffffffb00;
  undefined1 in_stack_fffffffffffffb17;
  SockAddrTy *in_stack_fffffffffffffb18;
  uint32_t in_stack_fffffffffffffb2c;
  anon_union_28_3_5f5bb294_for_SockAddrTy_0 *this_00;
  cmsghdr local_488 [64];
  size_t local_88;
  uint32_t local_80;
  anon_union_28_3_5f5bb294_for_SockAddrTy_0 local_7c;
  undefined1 local_5d;
  undefined1 *local_28;
  undefined8 *local_20;
  string *local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  if (((in_RDI->pMCAddr == (addrinfo *)0x0) || ((in_RDI->super_SocketNetworking).buf == (char *)0x0)
      ) || (local_28 = in_R8, local_20 = in_RCX, local_18 = in_RDX,
           bVar1 = SocketNetworking::isOpen(&in_RDI->super_SocketNetworking), !bVar1)) {
    local_5d = 1;
    uVar3 = __cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffab0,(char *)in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0
              );
    NetRuntimeError::NetRuntimeError(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    local_5d = 0;
    __cxa_throw(uVar3,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
  }
  SockAddrTy::SockAddrTy((SockAddrTy *)0x35462e);
  bVar2 = GetFamily(in_RDI);
  local_7c.sa.sa_family = (sa_family_t)bVar2;
  local_80 = 0;
  memset((in_RDI->super_SocketNetworking).buf,0,(in_RDI->super_SocketNetworking).bufSize);
  local_88 = 0;
  this_00 = &local_7c;
  SockAddrTy::size((SockAddrTy *)&local_7c.sa);
  pcVar6 = local_488;
  local_88 = recvmsg((in_RDI->super_SocketNetworking).f_socket,(msghdr *)&stack0xfffffffffffffb30,0)
  ;
  if (((long)local_88 < 0) && (piVar4 = __errno_location(), *piVar4 == 0xb)) {
    local_88 = 0;
  }
  if ((long)local_88 < 0) {
    uVar3 = __cxa_allocate_exception(0x50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffab0,(char *)in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0
              );
    NetRuntimeError::NetRuntimeError(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
    __cxa_throw(uVar3,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
  }
  if ((0 < (long)local_88) && (__cmsg = pcVar6, (local_9 & 1) != 0)) {
    for (; in_stack_fffffffffffffa70 = pcVar6, __cmsg != (cmsghdr *)0x0;
        __cmsg = __cmsg_nxthdr((msghdr *)&stack0xfffffffffffffb30,__cmsg)) {
      bVar1 = SockAddrTy::isIp4((SockAddrTy *)0x35488a);
      if (((bVar1) && (__cmsg->cmsg_level == 0)) && (__cmsg->cmsg_type == 8)) {
        local_80 = (uint32_t)__cmsg[1].cmsg_len;
        in_stack_fffffffffffffa70 = pcVar6;
        break;
      }
      bVar1 = SockAddrTy::isIp6((SockAddrTy *)0x3548e0);
      if (((bVar1) && (__cmsg->cmsg_level == 0x29)) && (__cmsg->cmsg_type == 0x32)) {
        local_510 = __cmsg + 1;
        local_80 = (uint32_t)__cmsg[2].cmsg_len;
        in_stack_fffffffffffffa70 = pcVar6;
        break;
      }
    }
  }
  if ((local_9 & 1) != 0) {
    local_518 = std::
                map<XPMP2::SockAddrTy,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::less<XPMP2::SockAddrTy>,_std::allocator<std::pair<const_XPMP2::SockAddrTy,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
                ::operator[]((map<XPMP2::SockAddrTy,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::less<XPMP2::SockAddrTy>,_std::allocator<std::pair<const_XPMP2::SockAddrTy,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
                              *)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
    local_528 = std::chrono::_V2::steady_clock::now();
    local_520 = (rep)std::chrono::operator-
                               (in_stack_fffffffffffffa78,
                                (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                 *)in_stack_fffffffffffffa70);
    local_534 = 0xb4;
    std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>(local_530,&local_534);
    bVar1 = std::chrono::operator<
                      (in_stack_fffffffffffffa80,
                       (duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffa78);
    if (bVar1) {
      local_80 = 0;
    }
    rVar5 = std::chrono::_V2::steady_clock::now();
    (local_518->__d).__r = rVar5;
  }
  if ((((local_9 & 1) == 0) || (local_80 == 0)) || (local_80 == in_RDI->oneIntfIdx)) {
    if (local_28 != (undefined1 *)0x0) {
      *local_28 = 0;
    }
  }
  else {
    SendToIntf((UDPMulticast *)&this_00->sa,in_stack_fffffffffffffb2c);
    if (local_28 != (undefined1 *)0x0) {
      *local_28 = 1;
    }
  }
  if (local_18 != (string *)0x0) {
    SocketNetworking::GetAddrString_abi_cxx11_
              (in_stack_fffffffffffffb18,(bool)in_stack_fffffffffffffb17);
    std::__cxx11::string::operator=(local_18,(string *)&stack0xfffffffffffffaa0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffaa0);
  }
  if (local_20 != (undefined8 *)0x0) {
    *local_20 = CONCAT62(local_7c._2_6_,local_7c.sa.sa_family);
    *(uchar (*) [8])(local_20 + 1) = local_7c.sa_in.sin_zero;
    local_20[2] = local_7c._16_8_;
    *(uint32_t *)(local_20 + 3) = local_7c.sa_in6.sin6_scope_id;
  }
  return local_88;
}

Assistant:

size_t UDPMulticast::RecvMC (bool bSwitchToRecvIntf,
                             std::string* _pFromAddr,
                             SockAddrTy* _pFromSockAddr,
                             bool* _pbIntfChanged)
{

    if (!pMCAddr || !buf || !isOpen())
        throw NetRuntimeError("RecvMC: Multicast socket not initialized");
    
    // Information vairables filled during the rcvmsg operation
    SockAddrTy sa;                              // socket address
    sa.sa.sa_family = GetFamily();
    uint32_t ifIdx = 0;                         // interface index the msg was received on

    memset(buf, 0, bufSize);
    ssize_t bytesRcvd = 0;
#if IBM
    // Set up msg header
    // Originally based on https://stackoverflow.com/a/37334943
    char msg_control[1024] = "";
    WSABUF  wsaBuf = { static_cast<ULONG>(bufSize), buf };
    DWORD br = 0;
    WSAMSG  msg = {
        &sa.sa,                 // LPSOCKADDR       name;              /* Remote address */
        sa.size(),              // INT              namelen;           /* Remote address length */
        &wsaBuf,                // LPWSABUF         lpBuffers;         /* Data buffer array */
        1,                      // ULONG            dwBufferCount;     /* Number of elements in the array */
        {                       // WSABUF           Control;           /* Control buffer */
            sizeof(msg_control),
            msg_control
        },
        0                       // ULONG            dwFlags;           /* Flags */
    };

    // Receive the message, fill the control info
    if (WSARecvMsg(&msg, &br, nullptr, nullptr) < 0) {
        if (errno != WSAEWOULDBLOCK)            // we ignore no-data events
            throw NetRuntimeError("RecvMC: WSARecvMsg failed");
    }
    bytesRcvd = (ssize_t)br;

    // loop the control headers to find which interface the msg was received on
    if (bytesRcvd > 0 && bSwitchToRecvIntf) {
        for (WSACMSGHDR* cmsg = WSA_CMSG_FIRSTHDR(&msg);
             cmsg;
             cmsg = WSA_CMSG_NXTHDR(&msg, cmsg))
        {
            if (sa.isIp4() && cmsg->cmsg_level == IPPROTO_IP && cmsg->cmsg_type == IP_PKTINFO)
            {
                const struct in_pktinfo* in_pktinfo = (struct in_pktinfo*)WSA_CMSG_DATA(cmsg);
                ifIdx = in_pktinfo->ipi_ifindex;
                break;
            }
            if (sa.isIp6() && cmsg->cmsg_level == IPPROTO_IPV6 && cmsg->cmsg_type == IPV6_PKTINFO)
            {
                const struct in6_pktinfo* in6_pktinfo = (struct in6_pktinfo*)WSA_CMSG_DATA(cmsg);
                ifIdx = in6_pktinfo->ipi6_ifindex;
                break;
            }
        }
    }

#else
    // Set up msg header
    // Originally based on https://stackoverflow.com/a/12398774
    char msg_control[1024];
    struct iovec iovec = { buf, bufSize };
    struct msghdr msg = {
        &sa.sa,                 //    void            *msg_name;      /* [XSI] optional address */
        sa.size(),              //    socklen_t       msg_namelen;    /* [XSI] size of address */
        &iovec,                 //    struct          iovec *msg_iov; /* [XSI] scatter/gather array */
        1,                      //    int             msg_iovlen;     /* [XSI] # elements in msg_iov */
        msg_control,            //    void            *msg_control;   /* [XSI] ancillary data, see below */
        sizeof(msg_control),    //    socklen_t       msg_controllen; /* [XSI] ancillary data buffer len */
        0                       //    int             msg_flags;      /* [XSI] flags on received message */
    };

    // Receive the message, fill the control info
    bytesRcvd = recvmsg(f_socket, &msg, 0);
    // We don't treat EAGAIN as an error...that just means we received nothing
    if (bytesRcvd < 0 && errno == EAGAIN)
        bytesRcvd = 0;
    if (bytesRcvd < 0)
        throw NetRuntimeError("RecvMC: recvfrom failed");

    // loop the control headers to find which interface the msg was received on
    if (bytesRcvd > 0 && bSwitchToRecvIntf) {
        for (struct cmsghdr* cmsg = CMSG_FIRSTHDR(&msg); cmsg != 0; cmsg = CMSG_NXTHDR(&msg, cmsg))
        {
            if (sa.isIp4() && cmsg->cmsg_level == IPPROTO_IP && cmsg->cmsg_type == IP_PKTINFO)
            {
                const struct in_pktinfo* in_pktinfo = (struct in_pktinfo*)CMSG_DATA(cmsg);
                ifIdx = in_pktinfo->ipi_ifindex;
                break;
            }
            if (sa.isIp6() && cmsg->cmsg_level == IPPROTO_IPV6 && cmsg->cmsg_type == IPV6_PKTINFO)
            {
                const struct in6_pktinfo* in6_pktinfo = (struct in6_pktinfo*)CMSG_DATA(cmsg);
                ifIdx = in6_pktinfo->ipi6_ifindex;
                break;
            }
        }
    }
#endif
    
    // Was that packet send from someplace we didn't hear yet or in some time?
    if (bSwitchToRecvIntf) {
        std::chrono::time_point<std::chrono::steady_clock> &lastRcvd = mapSender[sa];
        if (std::chrono::steady_clock::now() - lastRcvd < std::chrono::seconds(180))
            ifIdx = 0;                      // we know that sender and have heard from it in past 3 minutes, don't switch interface because of it
        lastRcvd = std::chrono::steady_clock::now();
    }
    
    // If requested, set outgoing interface (quick exit if no change)
    if (bSwitchToRecvIntf && ifIdx && ifIdx != oneIntfIdx) {
        SendToIntf(ifIdx);
        if (_pbIntfChanged) *_pbIntfChanged = true;
    }
    else
        if (_pbIntfChanged) *_pbIntfChanged = false;
        

    // Sender address wanted?
    if (_pFromAddr)
        *_pFromAddr = GetAddrString(sa);
    if (_pFromSockAddr)
        *_pFromSockAddr = sa;
    
    return size_t(bytesRcvd);
}